

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::SystemTaskBase::SystemTaskBase
          (SystemTaskBase *this,KnownSystemName knownNameId)

{
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__SystemTaskBase_00ddd7d8;
  return;
}

Assistant:

explicit SystemTaskBase(KnownSystemName knownNameId) :
        SystemSubroutine(knownNameId, SubroutineKind::Task) {}